

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtooltip.cpp
# Opt level: O3

void __thiscall QTipLabel::paintEvent(QTipLabel *this,QPaintEvent *ev)

{
  long in_FS_OFFSET;
  QStyleOptionFrame opt;
  undefined1 *local_98;
  QTipLabel *pQStack_90;
  QStyle *local_88;
  undefined1 *local_78;
  undefined1 *puStack_70;
  undefined1 *local_68;
  undefined1 *puStack_60;
  undefined1 *local_58;
  QPalettePrivate *pQStack_50;
  undefined1 *local_48;
  QObject *pQStack_40;
  undefined1 *local_38;
  undefined1 *puStack_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  local_88 = (QStyle *)&DAT_aaaaaaaaaaaaaaaa;
  local_98 = &DAT_aaaaaaaaaaaaaaaa;
  pQStack_90 = (QTipLabel *)&DAT_aaaaaaaaaaaaaaaa;
  QPainter::QPainter((QPainter *)&local_98);
  pQStack_90 = this;
  local_88 = QWidget::style((QWidget *)this);
  QPainter::begin((QPaintDevice *)&local_98);
  QPainter::setRenderHint((RenderHint)&local_98,true);
  local_38 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_30 = &DAT_aaaaaaaaaaaaaaaa;
  local_48 = &DAT_aaaaaaaaaaaaaaaa;
  pQStack_40 = (QObject *)&DAT_aaaaaaaaaaaaaaaa;
  local_58 = &DAT_aaaaaaaaaaaaaaaa;
  pQStack_50 = (QPalettePrivate *)&DAT_aaaaaaaaaaaaaaaa;
  local_68 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_60 = &DAT_aaaaaaaaaaaaaaaa;
  local_78 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_70 = &DAT_aaaaaaaaaaaaaaaa;
  QStyleOptionFrame::QStyleOptionFrame((QStyleOptionFrame *)&local_78);
  QStyleOption::initFrom((QStyleOption *)&local_78,(QWidget *)this);
  (**(code **)(*(long *)local_88 + 0xb0))
            (local_88,0x26,(QStyleOptionFrame *)&local_78,&local_98,pQStack_90);
  QPainter::end();
  QLabel::paintEvent(&this->super_QLabel,ev);
  QStyleOption::~QStyleOption((QStyleOption *)&local_78);
  QPainter::~QPainter((QPainter *)&local_98);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QTipLabel::paintEvent(QPaintEvent *ev)
{
    QStylePainter p(this);
    QStyleOptionFrame opt;
    opt.initFrom(this);
    p.drawPrimitive(QStyle::PE_PanelTipLabel, opt);
    p.end();

    QLabel::paintEvent(ev);
}